

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode deflate_unencode_write(connectdata *conn,contenc_writer *writer,char *buf,size_t nbytes)

{
  CURLcode CVar1;
  
  writer[1].handler = (content_encoding *)buf;
  *(int *)&writer[1].downstream = (int)nbytes;
  CVar1 = inflate_stream(conn,writer,ZLIB_INFLATING);
  return CVar1;
}

Assistant:

static CURLcode deflate_unencode_write(struct connectdata *conn,
                                       contenc_writer *writer,
                                       const char *buf, size_t nbytes)
{
  zlib_params *zp = (zlib_params *) &writer->params;
  z_stream *z = &zp->z;     /* zlib state structure */

  /* Set the compressed input when this function is called */
  z->next_in = (Bytef *) buf;
  z->avail_in = (uInt) nbytes;

  /* Now uncompress the data */
  return inflate_stream(conn, writer, ZLIB_INFLATING);
}